

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sxmlc.c
# Opt level: O3

SXML_CHAR * strip_spaces(SXML_CHAR *str,SXML_CHAR repl_sq)

{
  char cVar1;
  uint uVar2;
  ushort **ppuVar3;
  size_t sVar4;
  long lVar5;
  byte bVar6;
  uint uVar7;
  uint uVar8;
  ulong uVar9;
  ulong uVar10;
  byte *pbVar11;
  byte *pbVar12;
  
  bVar6 = *str;
  pbVar11 = (byte *)str;
  if ('\0' < (char)bVar6) {
    ppuVar3 = __ctype_b_loc();
    do {
      if ((*(byte *)((long)*ppuVar3 + (ulong)bVar6 * 2 + 1) & 0x20) == 0) break;
      bVar6 = pbVar11[1];
      pbVar11 = pbVar11 + 1;
    } while ('\0' < (char)bVar6);
  }
  sVar4 = strlen(str);
  uVar2 = (uint)sVar4;
  uVar9 = sVar4 & 0xffffffff;
  do {
    uVar7 = (uint)uVar9;
    uVar8 = ((int)uVar2 >> 0x1f & uVar2) - 1;
    if ((int)uVar7 < 1) goto LAB_00105dc8;
    uVar9 = uVar9 - 1;
    cVar1 = str[uVar9 & 0xffffffff];
  } while ((-1 < (long)cVar1) &&
          (ppuVar3 = __ctype_b_loc(), (*(byte *)((long)*ppuVar3 + (long)cVar1 * 2 + 1) & 0x20) != 0)
          );
  uVar8 = uVar7 - 1;
  if (cVar1 == '\\') {
    uVar8 = uVar7;
  }
LAB_00105dc8:
  str[(long)(int)uVar8 + 1] = '\0';
  if (repl_sq == '\0') {
    if (((pbVar11 != (byte *)str) || (uVar8 != uVar2)) &&
       (bVar6 = *pbVar11, *str = bVar6, bVar6 != 0)) {
      lVar5 = 1;
      do {
        bVar6 = pbVar11[lVar5];
        str[lVar5] = bVar6;
        lVar5 = lVar5 + 1;
      } while (bVar6 != 0);
    }
  }
  else {
    uVar9 = (ulong)*pbVar11;
    if (*pbVar11 == 0) {
      uVar10 = 0;
    }
    else {
      uVar10 = 0;
      do {
        if (((char)uVar9 < '\0') ||
           (ppuVar3 = __ctype_b_loc(),
           (*(byte *)((long)*ppuVar3 + (uVar9 & 0xff) * 2 + 1) & 0x20) == 0)) {
          pbVar12 = pbVar11 + ((char)uVar9 == '\\');
          pbVar11 = pbVar12 + 1;
          str[uVar10] = *pbVar12;
          uVar9 = (ulong)*pbVar11;
        }
        else {
          str[uVar10] = repl_sq;
          pbVar12 = pbVar11 + 1;
          do {
            pbVar11 = pbVar12;
            uVar9 = (ulong)*pbVar11;
            if ((char)*pbVar11 < '\0') goto LAB_00105e1a;
            uVar9 = (ulong)(char)pbVar11[2];
            pbVar12 = pbVar11 + 3;
          } while ((*(byte *)((long)*ppuVar3 + uVar9 * 2 + 1) & 0x20) != 0);
          pbVar11 = pbVar11 + 2;
        }
LAB_00105e1a:
        uVar10 = uVar10 + 1;
      } while ((char)uVar9 != '\0');
      uVar10 = uVar10 & 0xffffffff;
    }
    str[uVar10] = '\0';
  }
  return str;
}

Assistant:

SXML_CHAR* strip_spaces(SXML_CHAR* str, SXML_CHAR repl_sq)
{
	SXML_CHAR* p;
	int i, len;
	
	/* 'p' to the first non-space */
	for (p = str; *p != NULC && sx_isspace(*p); p++) ; /* No need to search for 'protect' as it is not a space */
	len = sx_strlen(str);
	for (i = len-1; i >= 0 && sx_isspace(str[i]); i--) ;
	if (i >= 0 && str[i] == C2SX('\\')) /* If last non-space is the protection, keep the last space */
		i++;
	str[i+1] = NULC; /* New end of string to last non-space */
	
	if (repl_sq == NULC) {
		if (p == str && i == len)
			return str; /* Nothing to do */
		for (i = 0; (str[i] = *p) != NULC; i++, p++) ; /* Copy 'p' to 'str' */
		return str;
	}
	
	/* Squeeze all spaces with 'repl_sq' */
	i = 0;
	while (*p != NULC) {
		if (sx_isspace(*p)) {
			str[i++] = repl_sq;
			while (sx_isspace(*++p)) ; /* Skips all next spaces */
		} else {
			if (*p == C2SX('\\'))
				p++;
			str[i++] = *p++;
		}
	}
	str[i] = NULC;
	
	return str;
}